

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

CallIndirect * __thiscall
wasm::I64ToI32Lowering::visitGenericCall<wasm::CallIndirect>
          (I64ToI32Lowering *this,CallIndirect *curr,BuilderFunc<wasm::CallIndirect> *callBuilder)

{
  IString str;
  bool bVar1;
  Index IVar2;
  Expression **ppEVar3;
  pointer pBVar4;
  pointer this_00;
  GlobalGet *value;
  Block *e_00;
  Iterator IVar5;
  I64ToI32Lowering *local_1e0;
  Block *result;
  LocalGet *local_178;
  LocalGet *getLow;
  size_t local_168;
  char *pcStack_160;
  string_view local_158;
  LocalSet *local_148;
  LocalSet *setHigh;
  LocalSet *doCall;
  I64ToI32Lowering *local_130;
  CallIndirect *call;
  undefined1 local_120 [8];
  TempVar highBits;
  undefined1 local_f8 [8];
  TempVar lowBits;
  CallIndirect *ret;
  Type local_b8;
  LocalGet *local_b0;
  undefined1 local_a8 [8];
  TempVar argHighBits;
  Expression *e;
  Iterator __end0;
  undefined1 local_60 [8];
  Iterator __begin0;
  ExpressionList *__range2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  bool fixed;
  BuilderFunc<wasm::CallIndirect> *callBuilder_local;
  CallIndirect *curr_local;
  I64ToI32Lowering *this_local;
  
  bVar1 = handleUnreachable(this,(Expression *)curr);
  if (bVar1) {
    this_local = (I64ToI32Lowering *)0x0;
  }
  else {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
    __begin0.index = (size_t)&curr->operands;
    IVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       __begin0.index);
    __begin0.parent = (ArenaVector<wasm::Expression_*> *)IVar5.index;
    local_60 = (undefined1  [8])IVar5.parent;
    IVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       __begin0.index);
    while( true ) {
      __end0.parent = (ArenaVector<wasm::Expression_*> *)IVar5.index;
      e = (Expression *)IVar5.parent;
      bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)local_60,(Iterator *)&e);
      if (!bVar1) break;
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_60);
      argHighBits.ty.id = (uintptr_t)*ppEVar3;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
                 (value_type *)&argHighBits.ty);
      bVar1 = hasOutParam(this,(Expression *)argHighBits.ty.id);
      if (bVar1) {
        fetchOutParam((TempVar *)local_a8,this,(Expression *)argHighBits.ty.id);
        pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_a8);
        wasm::Type::Type(&local_b8,i32);
        local_b0 = Builder::makeLocalGet(pBVar4,IVar2,local_b8);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
                   (value_type *)&local_b0);
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        TempVar::~TempVar((TempVar *)local_a8);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)local_60);
      IVar5.index = (size_t)__end0.parent;
      IVar5.parent = (ArenaVector<wasm::Expression_*> *)e;
    }
    ret._4_4_ = 3;
    bVar1 = wasm::Type::operator!=
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.
                        type,(BasicType *)((long)&ret + 4));
    if (bVar1) {
      local_1e0 = (I64ToI32Lowering *)
                  std::
                  function<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
                  ::operator()(callBuilder,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &__range2,
                               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).
                                     super_Expression.type.id);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)local_1e0);
      if ((args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        local_1e0 = (I64ToI32Lowering *)0x0;
      }
      this_local = local_1e0;
      lowBits.ty.id._4_4_ = 1;
    }
    else {
      wasm::Type::Type(&highBits.ty,i32);
      getTemp((TempVar *)local_f8,this,highBits.ty);
      wasm::Type::Type((Type *)&call,i32);
      getTemp((TempVar *)local_120,this,(Type)call);
      wasm::Type::Type((Type *)&doCall,i32);
      local_130 = (I64ToI32Lowering *)
                  std::
                  function<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
                  ::operator()(callBuilder,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &__range2,(Type)doCall);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_f8);
      setHigh = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)local_130);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_120);
      this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                          (&this->builder);
      local_168 = INT64_TO_32_HIGH_BITS;
      pcStack_160 = DAT_03192cd8;
      str.str._M_str = DAT_03192cd8;
      str.str._M_len = INT64_TO_32_HIGH_BITS;
      wasm::Name::Name((Name *)&local_158,str);
      wasm::Type::Type((Type *)&getLow,i32);
      value = Builder::makeGlobalGet(this_00,(Name)local_158,(Type)getLow);
      local_148 = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)value);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_f8);
      wasm::Type::Type((Type *)&result,i32);
      local_178 = Builder::makeLocalGet(pBVar4,IVar2,(Type)result);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      e_00 = Builder::blockify<wasm::LocalGet*>
                       (pBVar4,(Expression *)setHigh,(Expression *)local_148,local_178);
      setOutParam(this,(Expression *)e_00,(TempVar *)local_120);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)e_00);
      this_local = local_130;
      lowBits.ty.id._4_4_ = 1;
      TempVar::~TempVar((TempVar *)local_120);
      TempVar::~TempVar((TempVar *)local_f8);
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  }
  return (CallIndirect *)this_local;
}

Assistant:

T* visitGenericCall(T* curr, BuilderFunc<T> callBuilder) {
    if (handleUnreachable(curr)) {
      return nullptr;
    }
    bool fixed = false;
    std::vector<Expression*> args;
    for (auto* e : curr->operands) {
      args.push_back(e);
      if (hasOutParam(e)) {
        TempVar argHighBits = fetchOutParam(e);
        args.push_back(builder->makeLocalGet(argHighBits, Type::i32));
        fixed = true;
      }
    }
    if (curr->type != Type::i64) {
      auto* ret = callBuilder(args, curr->type);
      replaceCurrent(ret);
      return fixed ? ret : nullptr;
    }
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    auto* call = callBuilder(args, Type::i32);
    LocalSet* doCall = builder->makeLocalSet(lowBits, call);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits, builder->makeGlobalGet(INT64_TO_32_HIGH_BITS, Type::i32));
    LocalGet* getLow = builder->makeLocalGet(lowBits, Type::i32);
    Block* result = builder->blockify(doCall, setHigh, getLow);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
    return call;
  }